

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

DataHeader *
pointerTOCLookupFn(UDataMemory *pData,char *name,int32_t *pLength,UErrorCode *pErrorCode)

{
  int32_t *piVar1;
  int32_t iVar2;
  int32_t count;
  int32_t number;
  PointerTOC *toc;
  UErrorCode *pErrorCode_local;
  int32_t *pLength_local;
  char *name_local;
  UDataMemory *pData_local;
  
  if (pData->toc == (void *)0x0) {
    pData_local = (UDataMemory *)pData->pHeader;
  }
  else {
    piVar1 = (int32_t *)pData->toc;
    iVar2 = pointerTOCPrefixBinarySearch(name,(PointerTOCEntry *)(piVar1 + 2),*piVar1);
    if (iVar2 < 0) {
      pData_local = (UDataMemory *)0x0;
    }
    else {
      *pLength = -1;
      pData_local = (UDataMemory *)
                    UDataMemory_normalizeDataPointer_63(*(void **)(piVar1 + (long)iVar2 * 4 + 4));
    }
  }
  return (DataHeader *)pData_local;
}

Assistant:

static const DataHeader * U_CALLCONV pointerTOCLookupFn(const UDataMemory *pData,
                   const char *name,
                   int32_t *pLength,
                   UErrorCode *pErrorCode) {
    (void)pErrorCode;
    if(pData->toc!=NULL) {
        const PointerTOC *toc = (PointerTOC *)pData->toc;
        int32_t number, count=(int32_t)toc->count;

#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, toc->entry[number].entryName);
        }
#endif
        number=pointerTOCPrefixBinarySearch(name, toc->entry, count);
        if(number>=0) {
            /* found it */
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", toc->entry[number].entryName);
#endif
            *pLength=-1;
            return UDataMemory_normalizeDataPointer(toc->entry[number].pHeader);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", name);
#endif
            return NULL;
        }
    } else {
        return pData->pHeader;
    }
}